

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O1

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,string *configFile,string *ioInConfigFile,
          string *hostLanguage)

{
  pointer pcVar1;
  Comm local_98;
  string local_90;
  string local_70;
  string local_50;
  
  helper::CommDummy();
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (configFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + configFile->_M_string_length);
  pcVar1 = (ioInConfigFile->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + ioInConfigFile->_M_string_length);
  pcVar1 = (hostLanguage->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + hostLanguage->_M_string_length);
  Stream(this,name,mode,&local_98,&local_90,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  helper::Comm::~Comm(&local_98);
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, const std::string configFile,
               const std::string ioInConfigFile, const std::string hostLanguage)
: Stream(name, mode, helper::CommDummy(), configFile, ioInConfigFile, hostLanguage)
{
}